

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Set.hpp
# Opt level: O0

int __thiscall
Lib::Set<Kernel::Clause_*,_Lib::DefaultHash>::remove
          (Set<Kernel::Clause_*,_Lib::DefaultHash> *this,char *__filename)

{
  bool bVar1;
  undefined7 extraout_var;
  Set<Kernel::Clause_*,_Lib::DefaultHash> *pSVar2;
  Cell *cell;
  uint code;
  Cell *local_28;
  uint local_1c;
  Clause *local_18;
  Set<Kernel::Clause_*,_Lib::DefaultHash> *local_10;
  undefined1 local_1;
  
  local_18 = (Clause *)__filename;
  local_10 = this;
  local_1c = DefaultHash::hash<Kernel::Clause>((Clause *)this);
  if (local_1c < 2) {
    local_1c = 2;
  }
  local_28 = firstCellForCode(this,local_1c);
LAB_00ac1fa8:
  do {
    bVar1 = Cell::empty(local_28);
    pSVar2 = (Set<Kernel::Clause_*,_Lib::DefaultHash> *)(CONCAT71(extraout_var,bVar1) ^ 0xff);
    if (((ulong)pSVar2 & 1) == 0) {
      local_1 = 0;
LAB_00ac2047:
      return (int)CONCAT71((int7)((ulong)pSVar2 >> 8),local_1);
    }
    bVar1 = Cell::deleted(local_28);
    if (bVar1) {
      local_28 = nextCell(this,local_28);
      goto LAB_00ac1fa8;
    }
    if ((local_28->code == local_1c) &&
       (pSVar2 = this, bVar1 = DefaultHash::equals<Kernel::Clause*>(&local_28->value,&local_18),
       this = pSVar2, bVar1)) {
      local_28->code = 1;
      pSVar2->_size = pSVar2->_size - 1;
      local_1 = 1;
      goto LAB_00ac2047;
    }
    local_28 = nextCell(this,local_28);
  } while( true );
}

Assistant:

bool remove(const Val val)
  {
    unsigned code = Hash::hash(val);
    if (code < 2) {
      code = 2;
    }

    Cell* cell = firstCellForCode(code);
    while (! cell->empty()) {
      if (cell->deleted()) {
	cell = nextCell(cell);
	continue;
      }
      if (cell->code == code &&
	  Hash::equals(cell->value,val)) {
	cell->code = 1; // deleted
	_size--;
	return true;
      }
      cell = nextCell(cell);
    }
    return false;
  }